

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

int __thiscall
CVmObjBigNum::getp_rad2deg(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  ushort uVar1;
  err_frame_t *peVar2;
  CVmException *pCVar3;
  int iVar4;
  char *src;
  undefined8 *puVar5;
  long *plVar6;
  size_t prec;
  char *ext1;
  uint hdl1;
  char *new_ext;
  err_frame_t err_cur__;
  
  uVar1 = *(ushort *)(this->super_CVmObject).ext_;
  iVar4 = setup_getp_0(this,self,retval,argc,&new_ext);
  if (iVar4 == 0) {
    prec = (ulong)uVar1 + 2;
    src = cache_pi(prec);
    alloc_temp_regs(prec,1,&ext1,&hdl1);
    puVar5 = (undefined8 *)_ZTW11G_err_frame();
    err_cur__.prv_ = (err_frame_t *)*puVar5;
    plVar6 = (long *)_ZTW11G_err_frame();
    *plVar6 = (long)&err_cur__;
    err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
    if (err_cur__.state_ == 0) {
      copy_val(ext1,src,1);
      div_by_long(ext1,0xb4,(unsigned_long *)0x0);
      compute_quotient_into(new_ext,(char *)0x0,(this->super_CVmObject).ext_,ext1);
    }
    if (-1 < (short)err_cur__.state_) {
      err_cur__.state_ = err_cur__.state_ | 0x8000;
      release_temp_regs(1,(ulong)hdl1);
    }
    peVar2 = err_cur__.prv_;
    puVar5 = (undefined8 *)_ZTW11G_err_frame();
    *puVar5 = peVar2;
    if ((err_cur__.state_ & 0x4001U) != 0) {
      puVar5 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(byte *)*puVar5 & 2) != 0) {
        plVar6 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar6 + 0x10));
      }
      pCVar3 = err_cur__.exc_;
      plVar6 = (long *)_ZTW11G_err_frame();
      *(CVmException **)(*plVar6 + 0x10) = pCVar3;
      err_rethrow();
    }
    if ((err_cur__.state_ & 2U) != 0) {
      free(err_cur__.exc_);
    }
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_rad2deg(VMG_ vm_obj_id_t self,
                               vm_val_t *retval, uint *argc)
{
    char *new_ext;
    size_t prec = get_prec(ext_);
    uint hdl1;
    char *ext1;
    const char *pi;

    /* check arguments and set up the result */
    if (setup_getp_0(vmg_ self, retval, argc, &new_ext))
        return TRUE;

    /* cache pi to our working precision */
    pi = cache_pi(prec + 2);

    /* allocate a temporary register for pi/180 */
    alloc_temp_regs(prec + 2, 1, &ext1, &hdl1);

    /* catch errors so we can be sure to free registers */
    err_try
    {
        /* get pi to our precision */
        copy_val(ext1, pi, TRUE);

        /* divide pi by 180 */
        div_by_long(ext1, 180);

        /* divide by pi/180 */
        compute_quotient_into(new_ext, 0, ext_, ext1);
    }